

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall Server::do_socket(Server *this)

{
  uint __fd;
  int iVar1;
  in_addr_t iVar2;
  ulong uVar3;
  ulong uVar4;
  int enable;
  sockaddr sStack_40;
  Server *pSStack_28;
  undefined4 local_c;
  
  local_c = 1;
  uVar3 = 2;
  __fd = socket(2,0x801,0);
  this->server_sock = __fd;
  if ((int)__fd < 0) {
    do_socket();
  }
  else {
    uVar3 = (ulong)__fd;
    iVar1 = setsockopt(__fd,1,2,&local_c,4);
    if (-1 < iVar1) {
      uVar3 = (ulong)(uint)this->server_sock;
      iVar1 = setsockopt(this->server_sock,1,0xf,&local_c,4);
      if (-1 < iVar1) {
        return;
      }
      goto LAB_001049e1;
    }
  }
  do_socket();
LAB_001049e1:
  do_socket();
  sStack_40.sa_data[6] = '\0';
  sStack_40.sa_data[7] = '\0';
  sStack_40.sa_data[8] = '\0';
  sStack_40.sa_data[9] = '\0';
  sStack_40.sa_data[10] = '\0';
  sStack_40.sa_data[0xb] = '\0';
  sStack_40.sa_data[0xc] = '\0';
  sStack_40.sa_data[0xd] = '\0';
  sStack_40.sa_data._0_2_ = *(ushort *)(uVar3 + 0x58) << 8 | *(ushort *)(uVar3 + 0x58) >> 8;
  sStack_40.sa_family = 2;
  sStack_40.sa_data._2_4_ = 0;
  pSStack_28 = this;
  iVar2 = inet_addr(*(char **)(uVar3 + 0x38));
  sStack_40.sa_data._2_4_ = iVar2;
  uVar4 = (ulong)*(uint *)(uVar3 + 0x5c);
  iVar1 = bind(*(uint *)(uVar3 + 0x5c),&sStack_40,0x10);
  if (-1 < iVar1) {
    return;
  }
  do_bind();
  listen(*(int *)(uVar4 + 0x5c),5);
  return;
}

Assistant:

void Server::do_socket() {
    int enable = 1;
    this->server_sock = socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->server_sock);
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int)));
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEPORT, &enable, sizeof(int)));
}